

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O2

void test_common<double>(uint length,double value)

{
  uint *puVar1;
  undefined1 (*pauVar2) [16];
  _func_int ***ppp_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  uint i;
  int iVar22;
  double *pdVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  undefined8 *puVar26;
  ulong *puVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var31;
  undefined4 uVar32;
  uint uVar33;
  undefined4 uVar34;
  uint uVar35;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var36;
  ulong uVar37;
  undefined1 (*local_98) [16];
  shared_ptr<double> pa;
  shared_ptr<double> pb;
  
  pdVar23 = nosimd::common::malloc<double>(length + 1);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)&local_98,pdVar23,
             nosimd::common::free<double>);
  pdVar23 = nosimd::common::malloc<double>(length + 1);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)
             &pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pdVar23,
             nosimd::common::free<double>);
  uVar19 = (ulong)length;
  *(undefined8 *)(*local_98 + uVar19 * 8) = 0x405fc00000000000;
  (&(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar19] = (_func_int **)0x404f800000000000;
  uVar32 = SUB84(value,0);
  uVar34 = (undefined4)((ulong)value >> 0x20);
  pauVar24 = local_98;
  for (uVar28 = length; 7 < (int)uVar28; uVar28 = uVar28 - 8) {
    auVar4._8_4_ = uVar32;
    auVar4._0_8_ = value;
    auVar4._12_4_ = uVar34;
    *pauVar24 = auVar4;
    auVar5._8_4_ = uVar32;
    auVar5._0_8_ = value;
    auVar5._12_4_ = uVar34;
    pauVar24[1] = auVar5;
    auVar6._8_4_ = uVar32;
    auVar6._0_8_ = value;
    auVar6._12_4_ = uVar34;
    pauVar24[2] = auVar6;
    auVar7._8_4_ = uVar32;
    auVar7._0_8_ = value;
    auVar7._12_4_ = uVar34;
    pauVar24[3] = auVar7;
    pauVar24 = pauVar24 + 4;
  }
  if (3 < (int)uVar28) {
    auVar8._8_4_ = uVar32;
    auVar8._0_8_ = value;
    auVar8._12_4_ = uVar34;
    *pauVar24 = auVar8;
    auVar9._8_4_ = uVar32;
    auVar9._0_8_ = value;
    auVar9._12_4_ = uVar34;
    pauVar24[1] = auVar9;
    uVar28 = uVar28 - 4;
    pauVar24 = pauVar24 + 2;
  }
  if (1 < (int)uVar28) {
    auVar10._8_4_ = uVar32;
    auVar10._0_8_ = value;
    auVar10._12_4_ = uVar34;
    *pauVar24 = auVar10;
    uVar28 = uVar28 - 2;
    pauVar24 = pauVar24 + 1;
  }
  if (uVar28 != 0) {
    *(double *)*pauVar24 = value;
  }
  uVar25 = 0;
  while (uVar19 != uVar25) {
    lVar30 = uVar25 * 8;
    uVar25 = uVar25 + 1;
    if ((*(double *)(*local_98 + lVar30) != value) ||
       (NAN(*(double *)(*local_98 + lVar30)) || NAN(value))) {
      puVar26 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar26 = "void test_common(unsigned int, T) [T = double]";
      *(undefined4 *)(puVar26 + 1) = 0x16;
      *(uint *)((long)puVar26 + 0xc) = length;
      __cxa_throw(puVar26,&Exception::typeinfo,0);
    }
  }
  lVar30 = 0;
  for (uVar28 = length; 3 < (int)uVar28; uVar28 = uVar28 - 4) {
    puVar1 = (uint *)(*local_98 + lVar30);
    uVar15 = puVar1[2];
    uVar16 = puVar1[3];
    uVar29 = *(ulong *)(local_98[1] + lVar30);
    uVar25 = *(ulong *)((long)(local_98[1] + lVar30) + 8);
    uVar33 = *puVar1;
    uVar35 = puVar1[1];
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)puVar1;
      iVar22 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask);
      uVar33 = (uint)pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      uVar35 = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      if (iVar22 != 0) {
        sse::internals::abs_pd(double(int))::sign_mask._0_4_ = 0;
        sse::internals::abs_pd(double(int))::sign_mask._4_4_ = 0x80000000;
        sse::internals::abs_pd(double(int))::sign_mask._8_4_ = 0;
        sse::internals::abs_pd(double(int))::sign_mask._12_4_ = 0x80000000;
        __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
        uVar33 = (uint)pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        uVar35 = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      }
    }
    uVar21 = sse::internals::abs_pd(double(int))::sign_mask._12_4_;
    uVar20 = sse::internals::abs_pd(double(int))::sign_mask._8_4_;
    uVar34 = sse::internals::abs_pd(double(int))::sign_mask._4_4_;
    uVar32 = sse::internals::abs_pd(double(int))::sign_mask._0_4_;
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = uVar35;
      pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = uVar33;
      iVar22 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask);
      uVar33 = (uint)pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      uVar35 = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      if (iVar22 != 0) {
        sse::internals::abs_pd(double(int))::sign_mask._0_4_ = 0;
        sse::internals::abs_pd(double(int))::sign_mask._4_4_ = 0x80000000;
        sse::internals::abs_pd(double(int))::sign_mask._8_4_ = 0;
        sse::internals::abs_pd(double(int))::sign_mask._12_4_ = 0x80000000;
        __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
        uVar33 = (uint)pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        uVar35 = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      }
    }
    uVar17 = CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                      sse::internals::abs_pd(double(int))::sign_mask._0_4_);
    uVar25 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                       sse::internals::abs_pd(double(int))::sign_mask._8_4_) & uVar25;
    puVar1 = (uint *)((long)&(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar30);
    *puVar1 = ~uVar32 & uVar33;
    puVar1[1] = ~uVar34 & uVar35;
    puVar1[2] = ~uVar20 & uVar15;
    puVar1[3] = ~uVar21 & uVar16;
    auVar11._8_4_ = (int)uVar25;
    auVar11._0_8_ = ~uVar17 & uVar29;
    auVar11._12_4_ = (int)(uVar25 >> 0x20);
    *(undefined1 (*) [16])
     ((long)&pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar30) = auVar11;
    lVar30 = lVar30 + 0x20;
  }
  puVar27 = (ulong *)(*local_98 + lVar30);
  if ((int)uVar28 < 2) {
    pauVar24 = (undefined1 (*) [16])
               ((long)&(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                       ->_vptr__Sp_counted_base + lVar30);
  }
  else {
    uVar29 = *puVar27;
    uVar25 = puVar27[1];
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar22 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar22 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._4_4_ = 0x80000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._12_4_ = 0x80000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    uVar25 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                       sse::internals::abs_pd(double(int))::sign_mask._8_4_) & uVar25;
    pauVar2 = (undefined1 (*) [16])
              ((long)&(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_vptr__Sp_counted_base + lVar30);
    pauVar24 = pauVar2 + 1;
    auVar12._8_4_ = (int)uVar25;
    auVar12._0_8_ =
         ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                   sse::internals::abs_pd(double(int))::sign_mask._0_4_) & uVar29;
    auVar12._12_4_ = (int)(uVar25 >> 0x20);
    *pauVar2 = auVar12;
    uVar28 = uVar28 - 2;
    puVar27 = (ulong *)(local_98[1] + lVar30);
  }
  if (uVar28 != 0) {
    uVar25 = *puVar27;
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar22 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar22 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._4_4_ = 0x80000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._12_4_ = 0x80000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    *(ulong *)*pauVar24 =
         ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                   sse::internals::abs_pd(double(int))::sign_mask._0_4_) & uVar25;
  }
  uVar25 = 0;
  while (uVar19 != uVar25) {
    ppp_Var3 = &(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar25;
    uVar25 = uVar25 + 1;
    if (((double)*ppp_Var3 != value) || (NAN((double)*ppp_Var3) || NAN(value))) {
      puVar26 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar26 = "void test_common(unsigned int, T) [T = double]";
      *(undefined4 *)(puVar26 + 1) = 0x1d;
      *(uint *)((long)puVar26 + 0xc) = length;
      __cxa_throw(puVar26,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<double>
            ((double *)pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar25 = 0;
  while (uVar19 != uVar25) {
    ppp_Var3 = &(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar25;
    uVar25 = uVar25 + 1;
    if (((double)*ppp_Var3 != 0.0) || (NAN((double)*ppp_Var3))) {
      puVar26 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar26 = "void test_common(unsigned int, T) [T = double]";
      *(undefined4 *)(puVar26 + 1) = 0x24;
      *(uint *)((long)puVar26 + 0xc) = length;
      __cxa_throw(puVar26,&Exception::typeinfo,0);
    }
  }
  for (uVar25 = 0; pauVar24 = local_98,
      _Var31 = pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
      uVar28 = length, uVar19 != uVar25; uVar25 = uVar25 + 1) {
    *(double *)(*local_98 + uVar25 * 8) = (double)(uVar25 & 0xffffffff);
  }
  for (; 3 < (int)uVar28; uVar28 = uVar28 - 4) {
    uVar17 = *(ulong *)*pauVar24;
    uVar37 = *(ulong *)(*pauVar24 + 8);
    uVar29 = *(ulong *)pauVar24[1];
    uVar25 = *(ulong *)(pauVar24[1] + 8);
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar22 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar22 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._4_4_ = 0x80000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._12_4_ = 0x80000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    uVar18 = CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                      sse::internals::abs_pd(double(int))::sign_mask._8_4_);
    _Var36._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                            sse::internals::abs_pd(double(int))::sign_mask._0_4_);
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                      sse::internals::abs_pd(double(int))::sign_mask._0_4_),
       iVar22 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask),
       _Var36._M_pi = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
       iVar22 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._4_4_ = 0x80000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._12_4_ = 0x80000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
      _Var36 = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    }
    uVar37 = ~uVar18 & uVar37;
    uVar18 = CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                      sse::internals::abs_pd(double(int))::sign_mask._0_4_);
    uVar25 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                       sse::internals::abs_pd(double(int))::sign_mask._8_4_) & uVar25;
    (_Var31._M_pi)->_vptr__Sp_counted_base = (_func_int **)(~(ulong)_Var36._M_pi & uVar17);
    (_Var31._M_pi)->_M_use_count = (int)uVar37;
    (_Var31._M_pi)->_M_weak_count = (int)(uVar37 >> 0x20);
    _Var13._M_use_count = (int)uVar25;
    _Var13._vptr__Sp_counted_base = (_func_int **)(~uVar18 & uVar29);
    _Var13._M_weak_count = (_Atomic_word)(uVar25 >> 0x20);
    _Var31._M_pi[1] = _Var13;
    pauVar24 = pauVar24 + 2;
    _Var31._M_pi = _Var31._M_pi + 2;
  }
  if (1 < (int)uVar28) {
    uVar29 = *(ulong *)*pauVar24;
    uVar25 = *(ulong *)(*pauVar24 + 8);
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar22 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar22 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._4_4_ = 0x80000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._12_4_ = 0x80000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    uVar25 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                       sse::internals::abs_pd(double(int))::sign_mask._8_4_) & uVar25;
    _Var14._M_use_count = (int)uVar25;
    _Var14._vptr__Sp_counted_base =
         (_func_int **)
         (~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                    sse::internals::abs_pd(double(int))::sign_mask._0_4_) & uVar29);
    _Var14._M_weak_count = (_Atomic_word)(uVar25 >> 0x20);
    *_Var31._M_pi = _Var14;
    uVar28 = uVar28 - 2;
    pauVar24 = pauVar24 + 1;
    _Var31._M_pi = _Var31._M_pi + 1;
  }
  if (uVar28 != 0) {
    uVar25 = *(ulong *)*pauVar24;
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar22 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar22 != 0))
    {
      sse::internals::abs_pd(double(int))::sign_mask._0_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._4_4_ = 0x80000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_4_ = 0;
      sse::internals::abs_pd(double(int))::sign_mask._12_4_ = 0x80000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    (_Var31._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         (~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                    sse::internals::abs_pd(double(int))::sign_mask._0_4_) & uVar25);
  }
  uVar25 = 0;
  while (uVar19 != uVar25) {
    uVar29 = uVar25 & 0xffffffff;
    ppp_Var3 = &(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar25;
    uVar25 = uVar25 + 1;
    if (((double)*ppp_Var3 != (double)uVar29) || (NAN((double)*ppp_Var3) || NAN((double)uVar29))) {
      puVar26 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar26 = "void test_common(unsigned int, T) [T = double]";
      *(undefined4 *)(puVar26 + 1) = 0x2d;
      *(uint *)((long)puVar26 + 0xc) = length;
      __cxa_throw(puVar26,&Exception::typeinfo,0);
    }
  }
  if ((((*(double *)(*local_98 + uVar19 * 8) == 127.0) &&
       (!NAN(*(double *)(*local_98 + uVar19 * 8)))) &&
      ((double)(&(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _vptr__Sp_counted_base)[uVar19] == 63.0)) &&
     (!NAN((double)(&(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base)[uVar19]))) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa);
    return;
  }
  puVar26 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar26 = "void test_common(unsigned int, T) [T = double]";
  *(undefined4 *)(puVar26 + 1) = 0x31;
  *(uint *)((long)puVar26 + 0xc) = length;
  __cxa_throw(puVar26,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}